

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O2

FT_Error tt_cmap2_validate(FT_Byte *table,FT_Validator valid)

{
  FT_Byte FVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  FT_Byte *pFVar5;
  ushort uVar6;
  ushort *puVar7;
  long lVar8;
  ulong uVar9;
  ushort *puVar10;
  ushort uVar11;
  uint uVar12;
  uint local_48;
  
  if (valid->limit < table + 4) {
    ft_validator_error(valid,8);
  }
  uVar4 = *(ushort *)(table + 2) << 8 | *(ushort *)(table + 2) >> 8;
  if ((uVar4 < 0x206) || (valid->limit < table + uVar4)) {
    ft_validator_error(valid,8);
  }
  local_48 = 0;
  for (lVar8 = 0; (int)lVar8 != 0x100; lVar8 = lVar8 + 1) {
    FVar1 = table[lVar8 * 2 + 6];
    bVar2 = table[lVar8 * 2 + 7];
    if ((FT_VALIDATE_TIGHT < valid->level) && ((bVar2 & 7) != 0)) {
      ft_validator_error(valid,8);
    }
    uVar12 = (uint)(ushort)(CONCAT11(FVar1,bVar2) >> 3);
    if (local_48 < uVar12) {
      local_48 = uVar12;
    }
  }
  if (valid->limit < table + (ulong)local_48 * 8 + 0x20e) {
    ft_validator_error(valid,8);
  }
  puVar7 = (ushort *)(table + 0x206);
  for (uVar12 = 0; uVar12 <= local_48; uVar12 = uVar12 + 1) {
    uVar6 = puVar7[1] << 8 | puVar7[1] >> 8;
    puVar10 = puVar7 + 4;
    if (uVar6 != 0) {
      uVar3 = puVar7[2];
      uVar11 = puVar7[3];
      if ((FT_VALIDATE_TIGHT < valid->level) &&
         (((char)*puVar7 != '\0' || (0x100 - *(byte *)((long)puVar7 + 1) < (uint)uVar6)))) {
        ft_validator_error(valid,8);
      }
      uVar11 = uVar11 << 8 | uVar11 >> 8;
      if (uVar11 != 0) {
        pFVar5 = (FT_Byte *)((long)puVar7 + (ulong)uVar11 + 6);
        uVar9 = (ulong)((uint)uVar6 * 2);
        if ((pFVar5 < table + (ulong)local_48 * 8 + 0x20e) || (table + uVar4 < pFVar5 + uVar9)) {
          ft_validator_error(valid,9);
        }
        if (valid->level != FT_VALIDATE_DEFAULT) {
          puVar7 = (ushort *)(uVar9 + (long)puVar10);
          while (puVar10 < puVar7) {
            uVar6 = *puVar10;
            puVar10 = puVar10 + 1;
            uVar6 = uVar6 << 8 | uVar6 >> 8;
            if ((uVar6 != 0) &&
               ((uint)valid[1].jump_buffer[0].__jmpbuf[0] <=
                ((uint)uVar6 + (uint)(ushort)(uVar3 << 8 | uVar3 >> 8) & 0xffff))) {
              ft_validator_error(valid,0x10);
            }
          }
        }
      }
    }
    puVar7 = puVar10;
  }
  return 0;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  tt_cmap2_validate( FT_Byte*      table,
                     FT_Validator  valid )
  {
    FT_Byte*  p;
    FT_UInt   length;

    FT_UInt   n, max_subs;
    FT_Byte*  keys;        /* keys table     */
    FT_Byte*  subs;        /* sub-headers    */
    FT_Byte*  glyph_ids;   /* glyph ID array */


    if ( table + 2 + 2 > valid->limit )
      FT_INVALID_TOO_SHORT;

    p      = table + 2;           /* skip format */
    length = TT_NEXT_USHORT( p );

    if ( table + length > valid->limit || length < 6 + 512 )
      FT_INVALID_TOO_SHORT;

    keys = table + 6;

    /* parse keys to compute sub-headers count */
    p        = keys;
    max_subs = 0;
    for ( n = 0; n < 256; n++ )
    {
      FT_UInt  idx = TT_NEXT_USHORT( p );


      /* value must be multiple of 8 */
      if ( valid->level >= FT_VALIDATE_PARANOID && ( idx & 7 ) != 0 )
        FT_INVALID_DATA;

      idx >>= 3;

      if ( idx > max_subs )
        max_subs = idx;
    }

    FT_ASSERT( p == table + 518 );

    subs      = p;
    glyph_ids = subs + ( max_subs + 1 ) * 8;
    if ( glyph_ids > valid->limit )
      FT_INVALID_TOO_SHORT;

    /* parse sub-headers */
    for ( n = 0; n <= max_subs; n++ )
    {
      FT_UInt  first_code, code_count, offset;
      FT_Int   delta;


      first_code = TT_NEXT_USHORT( p );
      code_count = TT_NEXT_USHORT( p );
      delta      = TT_NEXT_SHORT( p );
      offset     = TT_NEXT_USHORT( p );

      /* many Dynalab fonts have empty sub-headers */
      if ( code_count == 0 )
        continue;

      /* check range within 0..255 */
      if ( valid->level >= FT_VALIDATE_PARANOID )
      {
        if ( first_code >= 256 || code_count > 256 - first_code )
          FT_INVALID_DATA;
      }

      /* check offset */
      if ( offset != 0 )
      {
        FT_Byte*  ids;


        ids = p - 2 + offset;
        if ( ids < glyph_ids || ids + code_count * 2 > table + length )
          FT_INVALID_OFFSET;

        /* check glyph IDs */
        if ( valid->level >= FT_VALIDATE_TIGHT )
        {
          FT_Byte*  limit = p + code_count * 2;
          FT_UInt   idx;


          for ( ; p < limit; )
          {
            idx = TT_NEXT_USHORT( p );
            if ( idx != 0 )
            {
              idx = (FT_UInt)( (FT_Int)idx + delta ) & 0xFFFFU;
              if ( idx >= TT_VALID_GLYPH_COUNT( valid ) )
                FT_INVALID_GLYPH_ID;
            }
          }
        }
      }
    }

    return FT_Err_Ok;
  }